

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_state_ast(int n,mpc_val_t **xs)

{
  mpc_state_t *__ptr;
  mpc_ast_t *pmVar1;
  undefined8 *in_RSI;
  mpc_ast_t *a;
  mpc_state_t *s;
  
  __ptr = (mpc_state_t *)*in_RSI;
  pmVar1 = mpc_ast_state((mpc_ast_t *)in_RSI[1],*__ptr);
  free(__ptr);
  return pmVar1;
}

Assistant:

mpc_val_t *mpcf_state_ast(int n, mpc_val_t **xs) {
  mpc_state_t *s = ((mpc_state_t**)xs)[0];
  mpc_ast_t *a = ((mpc_ast_t**)xs)[1];
  (void)n;
  a = mpc_ast_state(a, *s);
  free(s);
  return a;
}